

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::Checkbox(char *label,bool *v)

{
  float text_baseline_y;
  ImVec2 IVar1;
  uint uVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  int iVar7;
  char *text;
  ImGuiCol idx;
  ImVec2 pos;
  float fVar8;
  bool held;
  bool hovered;
  ImRect total_bb;
  bool local_ba;
  bool local_b9;
  ImVec2 local_b8;
  undefined8 uStack_b0;
  ImVec2 local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  char *local_60;
  ImVec2 local_58;
  ImRect local_48;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    local_60 = label;
    local_58 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_88 = GetFrameHeight();
    IVar1 = (this->DC).CursorPos;
    local_78 = IVar1.x;
    fStack_74 = IVar1.y;
    fVar8 = 0.0;
    if (0.0 < local_58.x) {
      fVar8 = (pIVar3->Style).ItemInnerSpacing.x + local_58.x;
    }
    text_baseline_y = (pIVar3->Style).FramePadding.y;
    uStack_70 = 0;
    local_48.Max.x = fVar8 + local_88 + local_78;
    local_48.Min = IVar1;
    local_48.Max.y = text_baseline_y + text_baseline_y + local_58.y + fStack_74;
    ItemSize(&local_48,text_baseline_y);
    bVar5 = false;
    bVar4 = ItemAdd(&local_48,id,(ImRect *)0x0,0);
    if (bVar4) {
      bVar5 = ButtonBehavior(&local_48,id,&local_b9,&local_ba,0);
      if (bVar5) {
        *v = (bool)(*v ^ 1);
        MarkItemEdited(id);
      }
      local_b8.y = fStack_74;
      local_b8.x = local_78;
      local_98 = local_88 + local_78;
      fStack_94 = local_88 + fStack_74;
      fStack_90 = local_88 + (float)uStack_70;
      fStack_8c = local_88 + (float)((ulong)uStack_70 >> 0x20);
      uStack_b0 = 0;
      RenderNavHighlight(&local_48,id,1);
      iVar7 = ((local_ba ^ 1U) & local_b9) + 7;
      idx = 9;
      if ((local_b9 & 1U) == 0) {
        idx = iVar7;
      }
      if (local_ba == false) {
        idx = iVar7;
      }
      IVar6 = GetColorU32(idx,1.0);
      IVar1.y = fStack_94;
      IVar1.x = local_98;
      RenderFrame(local_b8,IVar1,IVar6,true,(pIVar3->Style).FrameRounding);
      IVar6 = GetColorU32(0x12,1.0);
      uVar2 = (pIVar3->LastItemData).InFlags;
      if ((uVar2 & 0x40) == 0) {
        fVar8 = local_b8.y;
        if (*v != false) {
          fVar8 = 1.0;
          if (1.0 <= (float)(int)(local_88 / 6.0)) {
            fVar8 = (float)(int)(local_88 / 6.0);
          }
          local_b8.x = local_b8.y;
          uStack_b0 = CONCAT44(local_b8.y,local_b8.y);
          pos.x = local_78 + fVar8;
          pos.y = local_b8.y + fVar8;
          RenderCheckMark(this->DrawList,pos,IVar6,local_88 - (fVar8 + fVar8));
          fVar8 = local_b8.x;
        }
      }
      else {
        fVar8 = 1.0;
        if (1.0 <= (float)(int)(local_88 / 3.6)) {
          fVar8 = (float)(int)(local_88 / 3.6);
        }
        local_b8.x = local_b8.y;
        uStack_b0 = CONCAT44(local_b8.y,local_b8.y);
        local_a0.y = local_b8.y + fVar8;
        local_a0.x = local_78 + fVar8;
        local_38.x = local_98 - fVar8;
        local_38.y = fStack_94 - fVar8;
        ImDrawList::AddRectFilled
                  (this->DrawList,&local_a0,&local_38,IVar6,(pIVar3->Style).FrameRounding,0);
        fVar8 = local_b8.x;
      }
      local_a0.y = (pIVar3->Style).FramePadding.y + fVar8;
      local_a0.x = (pIVar3->Style).ItemInnerSpacing.x + local_98;
      if (pIVar3->LogEnabled == true) {
        if ((uVar2 & 0x40) == 0) {
          text = "[ ]";
          if (*v != false) {
            text = "[x]";
          }
        }
        else {
          text = "[~]";
        }
        LogRenderedText(&local_a0,text,(char *)0x0);
      }
      if (0.0 < local_58.x) {
        RenderText(local_a0,local_60,(char *)0x0,true);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}